

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

bool __thiscall
GdlSetAttrItem::GenerateAttrSettingCode
          (GdlSetAttrItem *this,GrcManager *pcman,uint32_t fxdRuleVersion,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbOutput,int irit,int nIIndex)

{
  pointer ppGVar1;
  GdlAttrValueSpec *this_00;
  bool bVar2;
  int iritAttachTo;
  size_t ipavs;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = false;
  uVar3 = 0;
  while( true ) {
    ppGVar1 = (this->m_vpavs).
              super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_vpavs).
                      super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar3)
    break;
    this_00 = ppGVar1[uVar3];
    iritAttachTo = (*(this->super_GdlRuleItem)._vptr_GdlRuleItem[0x15])(this);
    bVar2 = GdlAttrValueSpec::GenerateAttrSettingCode
                      (this_00,pcman,fxdRuleVersion,vbOutput,irit,nIIndex,iritAttachTo);
    bVar4 = (bool)(bVar4 | bVar2);
    uVar3 = uVar3 + 1;
  }
  return bVar4;
}

Assistant:

bool GdlSetAttrItem::GenerateAttrSettingCode(GrcManager * pcman, uint32_t fxdRuleVersion,
	std::vector<gr::byte> & vbOutput,
	int irit, int nIIndex)
{
	bool fAttachForward = false;
	for (size_t ipavs = 0; ipavs < m_vpavs.size(); ipavs++)
	{
		if (m_vpavs[ipavs]->GenerateAttrSettingCode(pcman, fxdRuleVersion, vbOutput,
			irit, nIIndex, AttachTo()))
		{
			fAttachForward = true;
		}
	}
	return fAttachForward;
}